

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool redit_mlist(CHAR_DATA *ch,char *argument)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  BUFFER *buffer;
  MOB_INDEX_DATA *pMVar5;
  char *pcVar6;
  long in_RDI;
  int col;
  int vnum;
  bool found;
  bool fAll;
  char arg [4608];
  BUFFER *buf1;
  char buf [4608];
  AREA_DATA_conflict *pArea;
  MOB_INDEX_DATA *pMobIndex;
  CHAR_DATA *in_stack_ffffffffffffdba8;
  char *in_stack_ffffffffffffdbb0;
  uint in_stack_ffffffffffffdbb8;
  int vnum_00;
  undefined4 in_stack_ffffffffffffdbc0;
  undefined2 in_stack_ffffffffffffdbc4;
  undefined1 in_stack_ffffffffffffdbc6;
  byte bVar7;
  undefined1 in_stack_ffffffffffffdbc7;
  char in_stack_ffffffffffffdbc8;
  undefined7 in_stack_ffffffffffffdbc9;
  char local_1228 [4568];
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  
  vnum_00 = 0;
  one_argument(in_stack_ffffffffffffdbb0,(char *)in_stack_ffffffffffffdba8);
  if (in_stack_ffffffffffffdbc8 == '\0') {
    send_to_char((char *)CONCAT17(in_stack_ffffffffffffdbc7,
                                  CONCAT16(in_stack_ffffffffffffdbc6,
                                           CONCAT24(in_stack_ffffffffffffdbc4,
                                                    in_stack_ffffffffffffdbc0))),
                 (CHAR_DATA *)CONCAT44(vnum_00,in_stack_ffffffffffffdbb8));
  }
  else {
    buffer = new_buf();
    lVar1 = *(long *)(*(long *)(in_RDI + 0xa8) + 0x30);
    bVar2 = str_cmp(&stack0xffffffffffffdbc8,"all");
    bVar3 = (bVar2 ^ 0xffU) & 1;
    bVar7 = 0;
    for (iVar4 = (int)*(short *)(lVar1 + 0x58); iVar4 <= *(short *)(lVar1 + 0x5a); iVar4 = iVar4 + 1
        ) {
      pMVar5 = get_mob_index(vnum_00);
      if ((pMVar5 != (MOB_INDEX_DATA *)0x0) &&
         (((bVar3 & 1) != 0 ||
          (bVar2 = is_name(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0), bVar2)))) {
        bVar7 = 1;
        in_stack_ffffffffffffdbb0 = local_1228;
        in_stack_ffffffffffffdbb8 = (uint)pMVar5->vnum;
        pcVar6 = capitalize(pMVar5->short_descr);
        sprintf(in_stack_ffffffffffffdbb0,"[%5d] %-17.16s",(ulong)in_stack_ffffffffffffdbb8,pcVar6);
        add_buf((BUFFER *)CONCAT71(in_stack_ffffffffffffdbc9,in_stack_ffffffffffffdbc8),
                (char *)CONCAT17(bVar3,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffdbc4,iVar4))));
        vnum_00 = vnum_00 + 1;
        if (vnum_00 % 3 == 0) {
          add_buf((BUFFER *)CONCAT71(in_stack_ffffffffffffdbc9,in_stack_ffffffffffffdbc8),
                  (char *)CONCAT17(bVar3,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffdbc4,iVar4))))
          ;
        }
      }
    }
    if ((bVar7 & 1) == 0) {
      send_to_char((char *)CONCAT17(bVar3,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffdbc4,iVar4)))
                   ,(CHAR_DATA *)CONCAT44(vnum_00,in_stack_ffffffffffffdbb8));
    }
    else {
      if (vnum_00 % 3 != 0) {
        add_buf((BUFFER *)CONCAT71(in_stack_ffffffffffffdbc9,in_stack_ffffffffffffdbc8),
                (char *)CONCAT17(bVar3,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffdbc4,iVar4))));
      }
      buf_string(buffer);
      page_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
      free_buf((BUFFER *)0x772218);
    }
  }
  return false;
}

Assistant:

bool redit_mlist(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMobIndex;
	AREA_DATA *pArea;
	char buf[MAX_STRING_LENGTH];
	BUFFER *buf1;
	char arg[MAX_INPUT_LENGTH];
	bool fAll, found;
	int vnum;
	int col = 0;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Syntax:  mlist <all/name>\n\r", ch);
		return false;
	}

	buf1 = new_buf();
	pArea = ch->in_room->area;
	/*    buf1[0] = '\0'; */
	fAll = !str_cmp(arg, "all");
	found = false;

	for (vnum = pArea->min_vnum; vnum <= pArea->max_vnum; vnum++)
	{
		pMobIndex = get_mob_index(vnum);

		if (pMobIndex != nullptr)
		{
			if (fAll || is_name(arg, pMobIndex->player_name))
			{
				found = true;

				sprintf(buf, "[%5d] %-17.16s", pMobIndex->vnum, capitalize(pMobIndex->short_descr));
				add_buf(buf1, buf);

				if (++col % 3 == 0)
					add_buf(buf1, "\n\r");
			}
		}
	}

	if (!found)
	{
		send_to_char("Mobile(s) not found in this area.\n\r", ch);
		return false;
	}

	if (col % 3 != 0)
		add_buf(buf1, "\n\r");

	page_to_char(buf_string(buf1), ch);
	free_buf(buf1);
	return false;
}